

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
backend::codegen::Codegen::emit_phi_move
          (Codegen *this,
          unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *i)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Reg RVar3;
  __node_base *p_Var4;
  Reg dest_reg;
  VarId collapsed;
  _Head_base<0UL,_arm::Inst_*,_false> local_a0;
  _Head_base<0UL,_arm::Arith2Inst_*,_false> local_98;
  uint local_90;
  undefined1 local_8c [20];
  Reg local_78;
  undefined2 local_74;
  VarId local_70;
  VarId local_60;
  undefined **local_50;
  uint32_t local_48;
  uint32_t local_38;
  
  p_Var4 = &(i->_M_h)._M_before_begin;
  local_8c._4_8_ = &this->inst;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    uVar1 = (uint32_t)((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor;
    local_50 = &PTR_display_001d90d0;
    local_48 = uVar1;
    get_collapsed_var((Codegen *)&stack0xffffffffffffffc0,(VarId *)this);
    uVar2 = local_38;
    if (local_38 != uVar1) {
      local_60.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_60.id = uVar1;
      RVar3 = get_or_alloc_vgp(this,&local_60);
      local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_70.id = uVar2;
      local_8c._0_4_ = get_or_alloc_vgp(this,&local_70);
      local_90 = 6;
      local_8c._12_8_ = &PTR_display_001db7d0;
      local_74 = 1;
      local_78 = RVar3;
      std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int&,arm::RegisterOperand>
                ((OpCode *)&local_98,&local_90,(RegisterOperand *)local_8c);
      local_a0._M_head_impl = &(local_98._M_head_impl)->super_Inst;
      local_98._M_head_impl = (Arith2Inst *)0x0;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)local_8c._4_8_,
                 (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_a0);
      if ((Arith2Inst *)local_a0._M_head_impl != (Arith2Inst *)0x0) {
        (*(((Inst *)&(local_a0._M_head_impl)->super_Displayable)->super_Displayable).
          _vptr_Displayable[2])();
      }
      local_a0._M_head_impl = (Inst *)0x0;
      std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)&local_98);
    }
  }
  return;
}

Assistant:

void Codegen::emit_phi_move(std::unordered_set<mir::inst::VarId>& i) {
  for (auto id : i) {
    auto collapsed = get_collapsed_var(id);
    if (collapsed == id) {
      continue;
    }
    auto src_reg = get_or_alloc_vgp(id);
    // display_reg_name(LOG(DEBUG), src_reg);
    // auto vis = std::set<mir::inst::VarId>();
    // for (auto it = collapsed.first; it != collapsed.second; it++) {
    //   if (vis.find(it->second) != vis.end()) continue;
    //   vis.insert(it->second);
    auto dest_reg = get_or_alloc_vgp(collapsed);
    inst.push_back(std::make_unique<Arith2Inst>(OpCode::Mov, dest_reg,
                                                RegisterOperand(src_reg)));
    // }
  }
}